

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void load_history(void)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  char (*to) [2048];
  char (*text) [2048];
  int max_files;
  int local_3c;
  Name local_38;
  
  Fl_Preferences::get(&fluid_prefs,"recent_files",&local_3c,5);
  if (local_3c < 0xb) {
    if (local_3c < 1) {
      uVar2 = 0;
      goto LAB_0019b452;
    }
  }
  else {
    local_3c = 10;
  }
  to = relative_history;
  text = absolute_history;
  lVar3 = 0;
  uVar2 = 0;
  do {
    Fl_Preferences::Name::Name(&local_38,"file%d",uVar2 & 0xffffffff);
    Fl_Preferences::get(&fluid_prefs,local_38.data_,*text,"",0x800);
    Fl_Preferences::Name::~Name(&local_38);
    if ((*text)[0] == '\0') break;
    fl_filename_relative(*to,0x800,*text);
    if (lVar3 == 0x1f8) {
      history_item[9].flags = 0x80;
    }
    else {
      *(undefined4 *)((long)&history_item->flags + lVar3) = 0;
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x38;
    to = to + 1;
    text = text + 1;
  } while ((long)uVar2 < (long)local_3c);
  if (9 < (uint)uVar2) {
    return;
  }
LAB_0019b452:
  uVar2 = uVar2 & 0xffffffff;
  piVar1 = &history_item[uVar2].flags;
  do {
    if (uVar2 != 0) {
      *(byte *)(piVar1 + -0xe) = *(byte *)(piVar1 + -0xe) | 0x80;
    }
    *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    uVar2 = uVar2 + 1;
    piVar1 = piVar1 + 0xe;
  } while (uVar2 != 10);
  return;
}

Assistant:

void load_history() {
  int	i;		// Looping var
  int	max_files;


  fluid_prefs.get("recent_files", max_files, 5);
  if (max_files > 10) max_files = 10;

  for (i = 0; i < max_files; i ++) {
    fluid_prefs.get( Fl_Preferences::Name("file%d", i), absolute_history[i], "", sizeof(absolute_history[i]));
    if (absolute_history[i][0]) {
      // Make a relative version of the filename for the menu...
      fl_filename_relative(relative_history[i], sizeof(relative_history[i]),
                           absolute_history[i]);

      if (i == 9) history_item[i].flags = FL_MENU_DIVIDER;
      else history_item[i].flags = 0;
    } else break;
  }

  for (; i < 10; i ++) {
    if (i) history_item[i-1].flags |= FL_MENU_DIVIDER;
    history_item[i].hide();
  }
}